

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O3

Matrix_t MatrixMultiply(int num,...)

{
  byte bVar1;
  undefined8 uVar2;
  ulong uVar3;
  char in_AL;
  float *pfVar4;
  undefined8 in_RCX;
  undefined8 in_RDX;
  ulong uVar5;
  ulong uVar6;
  byte bVar7;
  undefined8 in_RSI;
  long lVar8;
  float *pfVar9;
  ulong uVar10;
  undefined8 in_R8;
  undefined8 *puVar11;
  undefined8 *puVar12;
  undefined8 in_R9;
  ulong uVar13;
  float *pfVar14;
  ulong uVar15;
  ulong uVar16;
  undefined4 in_XMM0_Da;
  float fVar17;
  undefined4 in_XMM1_Da;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  Matrix_t MVar18;
  va_list argp;
  Matrix_t mat_group [10];
  float *local_1d8;
  uint local_1c8;
  undefined8 local_190;
  float *local_188;
  byte abStack_180 [2];
  uint6 uStack_17e;
  undefined8 local_e8 [4];
  undefined8 local_c8;
  undefined8 local_c0;
  undefined4 local_b8;
  undefined4 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  local_e8[1] = in_RSI;
  local_e8[2] = in_RDX;
  local_e8[3] = in_RCX;
  local_c8 = in_R8;
  local_c0 = in_R9;
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Da;
    local_a8 = in_XMM1_Da;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  puVar11 = (undefined8 *)&stack0x00000008;
  if (0 < num) {
    local_1c8 = 8;
    lVar8 = 0;
    do {
      if (local_1c8 < 0x21) {
        uVar5 = (ulong)local_1c8;
        local_1c8 = local_1c8 + 0x10;
        puVar12 = (undefined8 *)((long)local_e8 + uVar5);
      }
      else {
        puVar12 = puVar11;
        puVar11 = puVar11 + 2;
      }
      uVar2 = puVar12[1];
      *(undefined8 *)((long)&local_188 + lVar8) = *puVar12;
      *(undefined8 *)(abStack_180 + lVar8) = uVar2;
      lVar8 = lVar8 + 0x10;
    } while ((ulong)(uint)num << 4 != lVar8);
    if (num != 1) {
      local_1d8 = local_188;
      uVar5 = (ulong)abStack_180[0];
      uVar6 = 1;
      bVar7 = abStack_180[1];
      do {
        lVar8 = uVar6 * 0x10;
        local_190 = uVar6;
        if (*(byte *)((long)&local_190 + lVar8 + 1) != abStack_180[lVar8]) {
          puts("ERROR: Martixs sizes don\'t match!");
        }
        bVar1 = abStack_180[lVar8 + 1];
        uVar15 = (ulong)bVar1;
        pfVar4 = (float *)malloc((ulong)abStack_180[0] * 4 * uVar15);
        if (pfVar4 == (float *)0x0) {
          printf("ERROR: Malloc failed!-00");
        }
        uVar3 = local_190;
        if (uVar5 != 0) {
          uVar10 = 0;
          pfVar9 = local_1d8;
          do {
            if (bVar1 != 0) {
              lVar8 = 0;
              uVar13 = 0;
              do {
                if (bVar7 == 0) {
                  fVar17 = 0.0;
                }
                else {
                  pfVar14 = (float *)((long)(&local_188)[uVar6 * 2] + lVar8);
                  fVar17 = 0.0;
                  uVar16 = 0;
                  do {
                    fVar17 = fVar17 + pfVar9[uVar16] * *pfVar14;
                    uVar16 = uVar16 + 1;
                    pfVar14 = (float *)((long)pfVar14 + (ulong)((uint)bVar1 * 4));
                  } while (bVar7 != uVar16);
                }
                pfVar4[uVar10 * uVar15 + uVar13] = fVar17;
                uVar13 = uVar13 + 1;
                lVar8 = lVar8 + 4;
              } while (uVar13 != uVar15);
            }
            uVar10 = uVar10 + 1;
            pfVar9 = pfVar9 + bVar7;
          } while (uVar10 != uVar5);
        }
        if (local_190 != 1) {
          free(local_1d8);
        }
        uVar6 = uVar3 + 1;
        bVar7 = bVar1;
        local_1d8 = pfVar4;
      } while (uVar6 != (uint)num);
      uVar5 = (ulong)uStack_17e << 0x10 | (ulong)bVar1 << 8 | uVar5;
      goto LAB_0010b3fc;
    }
  }
  puts("ERROR: Martixs not enough!");
  pfVar4 = (float *)0x0;
  uVar5 = 0;
LAB_0010b3fc:
  MVar18.row = (char)uVar5;
  MVar18.column = (char)(uVar5 >> 8);
  MVar18._10_6_ = (int6)(uVar5 >> 0x10);
  MVar18.pMatrix = pfVar4;
  return MVar18;
}

Assistant:

Matrix_t MatrixMultiply(int num, ...)
{
	int i;
	float sum = 0;
	uint8_t c, r, k;
	Matrix_t mat_group[MATRIX_MAX_MULTIPLY];
	Matrix_t mat_res;
	Matrix_t mat_temp;
	Matrix_t mat_err = {NULL, 0, 0};

	va_list argp;
	va_start(argp, num);
	for (i = 0; i < num; i++)
	{
		mat_group[i] = va_arg(argp, Matrix_t);
	}
	va_end(argp);

	if (num < 2)
	{
		printf("ERROR: Martixs not enough!\n");
		return mat_err;
	}
	else
	{
		mat_res = mat_group[0];
		for (i = 1; i < num; i++)
		{
			if (mat_group[i - 1].column != mat_group[i].row)
			{
				printf("ERROR: Martixs sizes don't match!\n");
			}
			mat_temp.row = mat_res.row;
			mat_temp.column = mat_group[i].column;
			mat_temp.pMatrix = (float *)malloc(sizeof(float) * mat_temp.row * mat_temp.column); //注意有无内存泄漏
			if (mat_temp.pMatrix == NULL)
				printf("ERROR: Malloc failed!-00");
			for (r = 0; r < mat_res.row; r++)
			{
				for (c = 0; c < mat_group[i].column; c++)
				{
					for (k = 0; k < mat_res.column; k++)
					{
						sum = sum + *(mat_res.pMatrix + mat_res.column * r + k) * *(mat_group[i].pMatrix + k * mat_group[i].column + c);
					}
					*(mat_temp.pMatrix + r * mat_temp.column + c) = sum;
					sum = 0;
				}
			}
			if (i != 1)
				free(mat_res.pMatrix);
			mat_res = mat_temp;
		}
		//Martix_display(mat_temp);
	}
	return mat_res;
}